

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgtextelement.cpp
# Opt level: O0

float __thiscall
lunasvg::SVGTextPositioningElement::convertBaselineOffset
          (SVGTextPositioningElement *this,BaselineShift *baselineShift)

{
  LengthUnits LVar1;
  Type TVar2;
  Length *this_00;
  float fVar3;
  float fVar4;
  Length *length;
  BaselineShift *baselineShift_local;
  SVGTextPositioningElement *this_local;
  
  TVar2 = BaselineShift::type(baselineShift);
  if (TVar2 == Baseline) {
    this_local._4_4_ = 0.0;
  }
  else {
    TVar2 = BaselineShift::type(baselineShift);
    if (TVar2 == Sub) {
      fVar3 = Font::height(&this->m_font);
      this_local._4_4_ = -fVar3 / 2.0;
    }
    else {
      TVar2 = BaselineShift::type(baselineShift);
      if (TVar2 == Super) {
        fVar3 = Font::height(&this->m_font);
        this_local._4_4_ = fVar3 / 2.0;
      }
      else {
        this_00 = BaselineShift::length(baselineShift);
        LVar1 = Length::units(this_00);
        if (LVar1 == Percent) {
          fVar3 = Length::value(this_00);
          fVar4 = Font::size(&this->m_font);
          this_local._4_4_ = (fVar3 * fVar4) / 100.0;
        }
        else {
          LVar1 = Length::units(this_00);
          if (LVar1 == Ex) {
            fVar3 = Length::value(this_00);
            fVar4 = Font::size(&this->m_font);
            this_local._4_4_ = (fVar3 * fVar4) / 2.0;
          }
          else {
            LVar1 = Length::units(this_00);
            if (LVar1 == Em) {
              fVar3 = Length::value(this_00);
              fVar4 = Font::size(&this->m_font);
              this_local._4_4_ = fVar3 * fVar4;
            }
            else {
              this_local._4_4_ = Length::value(this_00);
            }
          }
        }
      }
    }
  }
  return this_local._4_4_;
}

Assistant:

float SVGTextPositioningElement::convertBaselineOffset(const BaselineShift& baselineShift) const
{
    if(baselineShift.type() == BaselineShift::Type::Baseline)
        return 0.f;
    if(baselineShift.type() == BaselineShift::Type::Sub)
        return -m_font.height() / 2.f;
    if(baselineShift.type() == BaselineShift::Type::Super) {
        return m_font.height() / 2.f;
    }

    const auto& length = baselineShift.length();
    if(length.units() == LengthUnits::Percent)
        return length.value() * m_font.size() / 100.f;
    if(length.units() == LengthUnits::Ex)
        return length.value() * m_font.size() / 2.f;
    if(length.units() == LengthUnits::Em)
        return length.value() * m_font.size();
    return length.value();
}